

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

uint32_t __thiscall Instance::makespan(Instance *this)

{
  pointer ppEVar1;
  Edge *pEVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  pointer pTVar8;
  pointer ppEVar9;
  bool bVar10;
  expr eVar11;
  model m;
  Train train;
  ast local_c8;
  pointer local_b8;
  pointer local_b0;
  model local_a8;
  ulong local_98;
  undefined8 uStack_90;
  ulong uStack_88;
  Edge *pEStack_80;
  vector<Stop,_std::allocator<Stop>_> local_78;
  vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  local_60;
  ast local_40;
  
  z3::optimize::get_model((optimize *)&local_a8);
  local_b8 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pTVar8 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  if (pTVar8 != local_b8) {
    do {
      local_98._0_4_ = pTVar8->id;
      local_98._4_4_ = pTVar8->speed;
      uStack_90 = *(undefined8 *)&pTVar8->length;
      uStack_88 = *(ulong *)&pTVar8->start;
      pEStack_80 = (pTVar8->start).stopEdge;
      std::vector<Stop,_std::allocator<Stop>_>::vector(&local_78,&pTVar8->stops);
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::vector(&local_60,&pTVar8->paths);
      uVar3 = this->maxTimeSteps;
      local_b0 = pTVar8;
      if (uVar3 == 0) {
        uVar5 = 0;
      }
      else {
        uVar7 = 0;
        bVar10 = false;
        uVar5 = 0;
        do {
          if (((uStack_88 & 0xffffffff) <= uVar7) && (!bVar10)) {
            uVar5 = uVar5 + 1;
            ppEVar9 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar1 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppEVar9 == ppEVar1) {
              bVar10 = false;
            }
            else {
              bVar10 = false;
              do {
                pEVar2 = *ppEVar9;
                z3::ast_vector_tpl<z3::expr>::operator[]
                          ((ast_vector_tpl<z3::expr> *)&local_40,
                           (int)(uVar7 << 4) +
                           (int)(this->occupiedVars).
                                super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_98 & 0xffffffff].
                                super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
                eVar11 = z3::model::eval((model *)&local_c8,(expr *)&local_a8,SUB81(&local_40,0));
                iVar4 = Z3_get_bool_value((local_c8.super_object.m_ctx)->m_ctx,local_c8.m_ast,
                                          eVar11.super_ast.m_ast);
                z3::ast::~ast(&local_c8);
                z3::ast::~ast(&local_40);
                if (iVar4 == 1) {
                  bVar10 = pEVar2 == local_78.super__Vector_base<Stop,_std::allocator<Stop>_>.
                                     _M_impl.super__Vector_impl_data._M_finish[-1].stopEdge;
                }
                ppEVar9 = ppEVar9 + 1;
              } while (ppEVar9 != ppEVar1);
              uVar3 = this->maxTimeSteps;
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar3);
      }
      if (uVar6 < uVar5) {
        uVar6 = uVar5;
      }
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::~vector(&local_60);
      if (local_78.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pTVar8 = local_b0 + 1;
    } while (pTVar8 != local_b8);
  }
  z3::model::~model(&local_a8);
  return uVar6;
}

Assistant:

uint32_t Instance::makespan() {
  model m = solver.get_model();
  uint32_t make_span = 0;
  for (Train train : trains) {
    uint32_t travel_time = 0;
    bool reachedGoal = false;
    for (size_t time = 0; time < maxTimeSteps; time++) {
      if(time < train.start.arrivalTime || reachedGoal){
        continue;
      }
      travel_time++;
      for (Edge *edge : graph.edges) {
        if (m.eval(occupiedVars[train.id][time][edge->id], false)
                .bool_value() == Z3_TRUE) {
          reachedGoal = edge == train.stops.back().stopEdge;
        }
      }
    }
    if(travel_time > make_span)
      make_span = travel_time;
  }
  return make_span;
}